

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

Result __thiscall tonk::gateway::ParsedXML::Parse(ParsedXML *this,char *data,uint bytes)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint in_ECX;
  long in_RDX;
  string *in_RSI;
  ErrorResult *in_RDI;
  bool end;
  char *tag;
  string tagData;
  char ch;
  uint i;
  string controlURL;
  string serviceType;
  bool inService;
  uint data_start;
  uint tag_start;
  string *in_stack_fffffffffffffd18;
  ErrorResult *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd48;
  allocator local_1f9;
  string local_1f8 [32];
  undefined4 local_1d8;
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  byte local_131;
  char *local_130;
  allocator local_111;
  string local_110 [35];
  char local_ed;
  uint local_ec;
  string local_e8 [32];
  string local_c8 [35];
  byte local_a5;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  long local_98;
  string *local_70;
  string *local_50;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_9c = in_ECX;
  local_98 = in_RDX;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  local_a0 = 0;
  local_a4 = 0;
  local_a5 = 0;
  std::__cxx11::string::string(local_c8);
  std::__cxx11::string::string(local_e8);
  for (local_ec = 0; local_ec < local_9c; local_ec = local_ec + 1) {
    local_ed = *(char *)(local_98 + (ulong)local_ec);
    if (local_a0 == 0) {
      if (local_ed == '<') {
        local_a0 = local_ec + 1;
      }
    }
    else if (local_ed == '>') {
      pcVar4 = (char *)(local_98 + (ulong)local_a0);
      uVar2 = local_ec - local_a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,pcVar4,(ulong)uVar2,&local_111);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      local_130 = (char *)std::__cxx11::string::c_str();
      local_131 = *local_130 == '/';
      if (((bool)local_131) && (local_130 = local_130 + 1, local_a4 < local_a0)) {
        if ((local_a5 & 1) == 0) {
          local_30 = "URLBase";
          local_28 = local_130;
          iVar3 = strcasecmp(local_130,"URLBase");
          if (iVar3 == 0) {
            pcVar4 = (char *)(local_98 + (ulong)local_a4);
            uVar2 = ~local_a4 + local_a0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a8,pcVar4,(ulong)uVar2,&local_1a9);
            std::__cxx11::string::operator=(in_RSI,local_1a8);
            std::__cxx11::string::~string(local_1a8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          }
        }
        else {
          local_10 = "serviceType";
          local_8 = local_130;
          iVar3 = strcasecmp(local_130,"serviceType");
          if (iVar3 == 0) {
            pcVar4 = (char *)(local_98 + (ulong)local_a4);
            uVar2 = ~local_a4 + local_a0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_158,pcVar4,(ulong)uVar2,&local_159);
            std::__cxx11::string::operator=(local_c8,local_158);
            std::__cxx11::string::~string(local_158);
            std::allocator<char>::~allocator((allocator<char> *)&local_159);
          }
          else {
            local_18 = local_130;
            local_20 = "controlURL";
            iVar3 = strcasecmp(local_130,"controlURL");
            if (iVar3 == 0) {
              pcVar4 = (char *)(local_98 + (ulong)local_a4);
              uVar2 = ~local_a4 + local_a0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_180,pcVar4,(ulong)uVar2,&local_181);
              std::__cxx11::string::operator=(local_e8,local_180);
              std::__cxx11::string::~string(local_180);
              std::allocator<char>::~allocator((allocator<char> *)&local_181);
            }
          }
        }
      }
      local_38 = local_130;
      local_40 = "service";
      iVar3 = strcasecmp(local_130,"service");
      if (iVar3 == 0) {
        if (((local_131 & 1) != 0) &&
           (bVar1 = IsWANConnectionServiceType(in_stack_fffffffffffffd48), bVar1)) {
          std::__cxx11::string::operator=(in_RSI + 0x20,local_c8);
          std::__cxx11::string::operator=(in_RSI + 0x40,local_e8);
        }
        local_a5 = (local_131 ^ 0xff) & 1;
      }
      local_a0 = 0;
      local_a4 = local_ec + 1;
      std::__cxx11::string::~string(local_110);
    }
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      Result::Success();
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f8,"Unable to find ControlURL",&local_1f9);
      local_50 = local_1f8;
      pcVar4 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      in_RDI->Source = pcVar4;
      std::__cxx11::string::~string(local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d0,"Unable to find ServiceType",&local_1d1);
    local_70 = local_1d0;
    pcVar4 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    in_RDI->Source = pcVar4;
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  local_1d8 = 1;
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_c8);
  return (Result)in_RDI;
}

Assistant:

Result ParsedXML::Parse(const char* data, unsigned bytes)
{
    URLBase.clear();
    ServiceType.clear();
    ControlURL.clear();

    unsigned tag_start = 0, data_start = 0;
    bool inService = false;
    std::string serviceType, controlURL;

    for (unsigned i = 0; i < bytes; ++i)
    {
        char ch = data[i];
        if (tag_start != 0)
        {
            if (ch == '>')
            {
                std::string tagData(data + tag_start, i - tag_start);
                const char* tag = tagData.c_str();
                bool end = (tag[0] == '/');

                if (end)
                {
                    ++tag;
                    if (tag_start > data_start)
                    {
                        if (inService)
                        {
                            if (0 == StrCaseCompare(tag, "serviceType")) {
                                serviceType = std::string(data + data_start, tag_start - data_start - 1);
                            }
                            else if (0 == StrCaseCompare(tag, "controlURL")) {
                                controlURL = std::string(data + data_start, tag_start - data_start - 1);
                            }
                        }
                        else if (0 == StrCaseCompare(tag, "URLBase")) {
                            URLBase = std::string(data + data_start, tag_start - data_start - 1);
                        }
                    }
                }

                if (0 == StrCaseCompare(tag, "service"))
                {
                    if (end && IsWANConnectionServiceType(serviceType))
                    {
                        ServiceType = serviceType;
                        ControlURL = controlURL;
                    }
                    inService = !end;
                }

                tag_start = 0;
                data_start = i + 1;
            }
        }
        else if (ch == '<') {
            tag_start = i + 1;
        }
    }

    if (ServiceType.empty()) {
        return Result("Unable to find ServiceType");
    }
    if (ControlURL.empty()) {
        return Result("Unable to find ControlURL");
    }
    return Result::Success();
}